

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_4::Validator::OnBrTableExpr(Validator *this,BrTableExpr *expr)

{
  bool bVar1;
  Result RVar2;
  Var local_e8;
  Enum local_9c;
  Var local_98;
  Enum local_4c;
  reference local_48;
  Var *var;
  iterator __end2;
  iterator __begin2;
  VarVector *__range2;
  BrTableExpr *expr_local;
  Validator *this_local;
  
  RVar2 = SharedValidator::BeginBrTable
                    (&this->validator_,&(expr->super_ExprMixin<(wabt::ExprType)11>).super_Expr.loc);
  Result::operator|=(&this->result_,RVar2);
  __end2 = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::begin(&expr->targets);
  var = (Var *)std::vector<wabt::Var,_std::allocator<wabt::Var>_>::end(&expr->targets);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>
                                *)&var);
    if (!bVar1) break;
    local_48 = __gnu_cxx::
               __normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>::
               operator*(&__end2);
    Var::Var(&local_98,local_48);
    local_4c = (Enum)SharedValidator::OnBrTableTarget
                               (&this->validator_,
                                &(expr->super_ExprMixin<(wabt::ExprType)11>).super_Expr.loc,
                                &local_98);
    Result::operator|=(&this->result_,(Result)local_4c);
    Var::~Var(&local_98);
    __gnu_cxx::__normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>::
    operator++(&__end2);
  }
  Var::Var(&local_e8,&expr->default_target);
  local_9c = (Enum)SharedValidator::OnBrTableTarget
                             (&this->validator_,
                              &(expr->super_ExprMixin<(wabt::ExprType)11>).super_Expr.loc,&local_e8)
  ;
  Result::operator|=(&this->result_,(Result)local_9c);
  Var::~Var(&local_e8);
  RVar2 = SharedValidator::EndBrTable
                    (&this->validator_,&(expr->super_ExprMixin<(wabt::ExprType)11>).super_Expr.loc);
  Result::operator|=(&this->result_,RVar2);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnBrTableExpr(BrTableExpr* expr) {
  result_ |= validator_.BeginBrTable(expr->loc);
  for (const Var& var : expr->targets) {
    result_ |= validator_.OnBrTableTarget(expr->loc, var);
  }
  result_ |= validator_.OnBrTableTarget(expr->loc, expr->default_target);
  result_ |= validator_.EndBrTable(expr->loc);
  return Result::Ok;
}